

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiView.cpp
# Opt level: O3

string * Imf_2_5::channelInOtherView
                   (string *__return_storage_ptr__,string *channelName,ChannelList *channelList,
                   StringVector *multiView,string *otherViewName)

{
  _Base_ptr __s;
  string *psVar1;
  bool bVar2;
  int iVar3;
  const_iterator cVar4;
  ConstIterator CVar5;
  allocator<char> local_a2;
  allocator<char> local_a1;
  string *local_a0;
  string local_98;
  string *local_78;
  string local_70;
  string local_50;
  
  local_a0 = __return_storage_ptr__;
  local_78 = channelName;
  cVar4._M_node = (_Base_ptr)ChannelList::begin(channelList);
  while( true ) {
    CVar5 = ChannelList::end(channelList);
    psVar1 = local_a0;
    if ((const_iterator)cVar4._M_node == CVar5._i._M_node) {
      (local_a0->_M_dataplus)._M_p = (pointer)&local_a0->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"");
      return psVar1;
    }
    __s = cVar4._M_node + 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,(char *)__s,&local_a1);
    viewFromChannelName(&local_98,&local_50,multiView);
    if ((local_98._M_string_length == otherViewName->_M_string_length) &&
       ((local_98._M_string_length == 0 ||
        (iVar3 = bcmp(local_98._M_dataplus._M_p,(otherViewName->_M_dataplus)._M_p,
                      local_98._M_string_length), iVar3 == 0)))) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,(char *)__s,&local_a2);
      bVar2 = areCounterparts(&local_70,local_78,multiView);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      bVar2 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    psVar1 = local_a0;
    if (bVar2 != false) break;
    cVar4._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar4._M_node);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_a0,(char *)__s,(allocator<char> *)&local_98);
  return psVar1;
}

Assistant:

string
channelInOtherView (const string &channelName,
		    const ChannelList &channelList,
		    const StringVector &multiView,
		    const string &otherViewName)
{
    //
    // Given the name of a channel in one view, return the
    // corresponding channel name for view otherViewName.
    //

    for (ChannelList::ConstIterator i=channelList.begin();
	 i != channelList.end();
	 ++i)
    {
	if (viewFromChannelName (i.name(), multiView) == otherViewName &&
	    areCounterparts (i.name(), channelName, multiView))
	{
	    return i.name(); 
	}
    }

    return "";
}